

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O2

void secp256k1_fe_impl_normalize_weak(secp256k1_fe *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = r->n[4];
  uVar2 = (uVar1 >> 0x30) * 0x1000003d1 + r->n[0];
  uVar3 = (uVar2 >> 0x34) + r->n[1];
  uVar4 = (uVar3 >> 0x34) + r->n[2];
  uVar5 = (uVar4 >> 0x34) + r->n[3];
  r->n[0] = uVar2 & 0xfffffffffffff;
  r->n[1] = uVar3 & 0xfffffffffffff;
  r->n[2] = uVar4 & 0xfffffffffffff;
  r->n[3] = uVar5 & 0xfffffffffffff;
  r->n[4] = (uVar5 >> 0x34) + (uVar1 & 0xffffffffffff);
  return;
}

Assistant:

static void secp256k1_fe_impl_normalize_weak(secp256k1_fe *r) {
    uint64_t t0 = r->n[0], t1 = r->n[1], t2 = r->n[2], t3 = r->n[3], t4 = r->n[4];

    /* Reduce t4 at the start so there will be at most a single carry from the first pass */
    uint64_t x = t4 >> 48; t4 &= 0x0FFFFFFFFFFFFULL;

    /* The first pass ensures the magnitude is 1, ... */
    t0 += x * 0x1000003D1ULL;
    t1 += (t0 >> 52); t0 &= 0xFFFFFFFFFFFFFULL;
    t2 += (t1 >> 52); t1 &= 0xFFFFFFFFFFFFFULL;
    t3 += (t2 >> 52); t2 &= 0xFFFFFFFFFFFFFULL;
    t4 += (t3 >> 52); t3 &= 0xFFFFFFFFFFFFFULL;

    /* ... except for a possible carry at bit 48 of t4 (i.e. bit 256 of the field element) */
    VERIFY_CHECK(t4 >> 49 == 0);

    r->n[0] = t0; r->n[1] = t1; r->n[2] = t2; r->n[3] = t3; r->n[4] = t4;
}